

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O2

string * __thiscall
mp::NLModel::WriteNL
          (string *__return_storage_ptr__,NLModel *this,string *fln,NLW2_NLOptionsBasic_C opts,
          NLUtils *ut,PreprocessData *pd)

{
  NLFeeder_Easy nlf;
  undefined1 auStack_318 [8];
  _Alloc_hider local_310;
  size_type local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  NLFeeder_Easy local_2f0;
  
  NLFeeder_Easy::NLFeeder_Easy(&local_2f0,this,opts);
  NLFeeder_Easy::ExportPreproData(&local_2f0,pd);
  WriteNLFile<mp::NLFeeder_Easy>((WriteNLResult *)auStack_318,fln,&local_2f0,ut);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_p == &local_300) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_300._M_allocated_capacity._1_7_,local_300._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_300._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_310._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_300._M_allocated_capacity._1_7_,local_300._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_308;
  local_308 = 0;
  local_300._M_local_buf[0] = '\0';
  local_310._M_p = (pointer)&local_300;
  std::__cxx11::string::~string((string *)&local_310);
  NLFeeder_Easy::~NLFeeder_Easy(&local_2f0);
  return __return_storage_ptr__;
}

Assistant:

std::string NLModel::WriteNL(
    const std::string &fln, NLW2_NLOptionsBasic_C opts,
    NLUtils &ut, PreprocessData &pd) {
  NLFeeder_Easy nlf(*this, opts);
  nlf.ExportPreproData(pd);
  return WriteNLFile(fln, nlf, ut).second;
}